

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# except.hh
# Opt level: O2

void kratos::print_nodes<kratos::IRNode_const*>
               (vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_> *nodes)

{
  pointer ppIVar1;
  IRNode **node;
  pointer ppIVar2;
  
  ppIVar1 = (nodes->
            super__Vector_base<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>).
            _M_impl.super__Vector_impl_data._M_finish;
  for (ppIVar2 = (nodes->
                 super__Vector_base<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>
                 )._M_impl.super__Vector_impl_data._M_start; ppIVar2 != ppIVar1;
      ppIVar2 = ppIVar2 + 1) {
    if (*ppIVar2 != (IRNode *)0x0) {
      print_ast_node(*ppIVar2);
    }
  }
  return;
}

Assistant:

void print_nodes(const std::vector<T> &nodes) {
    for (auto const &node : nodes) {
        if (node)
            print_ast_node(node);
    }
}